

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O3

Dec_Graph_t * Dec_Factor(char *pSop)

{
  int *piVar1;
  char *pcVar2;
  byte bVar3;
  uint uVar4;
  Mvc_Manager_t *pMem;
  int iVar5;
  uint uVar6;
  Dec_Edge_t DVar7;
  Dec_Graph_t *pFForm;
  undefined8 *puVar8;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar9;
  Mvc_Cube_t *pMVar10;
  Dec_Node_t *__s;
  byte bVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  Mvc_List_t *pList;
  
  iVar5 = Abc_SopIsConst0(pSop);
  if (iVar5 == 0) {
    iVar5 = Abc_SopIsConst1(pSop);
    if (iVar5 == 0) {
      puVar8 = (undefined8 *)Abc_FrameReadManDec();
      pMem = (Mvc_Manager_t *)*puVar8;
      iVar5 = Abc_SopGetVarNum(pSop);
      if (iVar5 < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x151,"Mvc_Cover_t *Dec_ConvertSopToMvc(char *)");
      }
      pCover = Mvc_CoverAlloc(pMem,iVar5 * 2);
      if (*pSop != '\0') {
        pcVar13 = pSop;
LAB_005cda2b:
        pMVar9 = Mvc_CubeAlloc(pCover);
        pMVar10 = (Mvc_Cube_t *)&pCover->lCubes;
        if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar10 = (pCover->lCubes).pTail;
        }
        pMVar10->pNext = pMVar9;
        (pCover->lCubes).pTail = pMVar9;
        pMVar9->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
        uVar4 = *(uint *)&pMVar9->field_0x8;
        uVar6 = uVar4 & 0xffffff;
        bVar11 = (byte)(uVar4 >> 0x18);
        if ((ulong)uVar6 == 1) {
          pMVar9->pData[0] = 0xffffffff;
          *(uint *)&pMVar9->field_0x14 = 0xffffffff >> (bVar11 & 0x1f);
        }
        else if (uVar6 == 0) {
          pMVar9->pData[0] = 0xffffffff >> (bVar11 & 0x1f);
        }
        else {
          pMVar9->pData[uVar6] = 0xffffffff >> (bVar11 & 0x1f);
          memset(pMVar9->pData,0xff,(ulong)((uVar4 & 0xffffff) << 2));
        }
        bVar11 = 0;
        uVar12 = 0;
        do {
          bVar3 = pcVar13[uVar12];
          if (bVar3 < 0x31) {
            iVar14 = 2;
            if (bVar3 == 0x30) {
LAB_005cdaec:
              pMVar9->pData[uVar12 >> 4 & 0xfffffff] =
                   pMVar9->pData[uVar12 >> 4 & 0xfffffff] & ~(iVar14 << (bVar11 & 0x1e));
            }
            else if ((bVar3 == 0) || (bVar3 == 0x20)) goto LAB_005cdb07;
          }
          else if (bVar3 == 0x31) {
            iVar14 = 1;
            goto LAB_005cdaec;
          }
          uVar12 = uVar12 + 1;
          bVar11 = bVar11 + 2;
        } while( true );
      }
LAB_005cdb16:
      Mvc_CoverContain(pCover);
      iVar5 = Mvc_CoverIsEmpty(pCover);
      if (iVar5 != 0) {
        __assert_fail("!Mvc_CoverIsEmpty(pCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x4b,"Dec_Graph_t *Dec_Factor(char *)");
      }
      iVar5 = Mvc_CoverIsTautology(pCover);
      if (iVar5 != 0) {
        __assert_fail("!Mvc_CoverIsTautology(pCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x4c,"Dec_Graph_t *Dec_Factor(char *)");
      }
      Mvc_CoverInverse(pCover);
      iVar5 = Abc_SopGetVarNum(pSop);
      pFForm = (Dec_Graph_t *)calloc(1,0x20);
      pFForm->nLeaves = iVar5;
      pFForm->nSize = iVar5;
      pFForm->nCap = iVar5 * 2 + 0x32;
      __s = (Dec_Node_t *)malloc((long)(iVar5 * 2) * 0x18 + 0x4b0);
      pFForm->pNodes = __s;
      memset(__s,0,(long)iVar5 * 0x18);
      DVar7 = Dec_Factor_rec(pFForm,pCover);
      pFForm->eRoot = DVar7;
      iVar5 = Abc_SopIsComplement(pSop);
      if (iVar5 != 0) {
        *(byte *)&pFForm->eRoot = *(byte *)&pFForm->eRoot ^ 1;
      }
      Mvc_CoverFree(pCover);
    }
    else {
      pFForm = (Dec_Graph_t *)calloc(1,0x20);
      pFForm->fConst = 1;
    }
  }
  else {
    pFForm = (Dec_Graph_t *)calloc(1,0x20);
    pFForm->fConst = 1;
    pFForm->eRoot = (Dec_Edge_t)0x1;
  }
  return pFForm;
LAB_005cdb07:
  pcVar2 = pcVar13 + (iVar5 + 3U);
  pcVar13 = pcVar13 + (iVar5 + 3U);
  if (*pcVar2 == '\0') goto LAB_005cdb16;
  goto LAB_005cda2b;
}

Assistant:

Dec_Graph_t * Dec_Factor( char * pSop )
{
    Mvc_Cover_t * pCover;
    Dec_Graph_t * pFForm;
    Dec_Edge_t eRoot;
    if ( Abc_SopIsConst0(pSop) )
        return Dec_GraphCreateConst0();
    if ( Abc_SopIsConst1(pSop) )
        return Dec_GraphCreateConst1();

    // derive the cover from the SOP representation
    pCover = Dec_ConvertSopToMvc( pSop );

    // make sure the cover is CCS free (should be done before CST)
    Mvc_CoverContain( pCover );

    // check for trivial functions
    assert( !Mvc_CoverIsEmpty(pCover) );
    assert( !Mvc_CoverIsTautology(pCover) );

    // perform CST
    Mvc_CoverInverse( pCover ); // CST
    // start the factored form
    pFForm = Dec_GraphCreate( Abc_SopGetVarNum(pSop) );
    // factor the cover
    eRoot = Dec_Factor_rec( pFForm, pCover );
    // finalize the factored form
    Dec_GraphSetRoot( pFForm, eRoot );
    // complement the factored form if SOP is complemented
    if ( Abc_SopIsComplement(pSop) )
        Dec_GraphComplement( pFForm );
    // verify the factored form
//    if ( !Dec_FactorVerify( pSop, pFForm ) )
//        printf( "Verification has failed.\n" );
//    Mvc_CoverInverse( pCover ); // undo CST
    Mvc_CoverFree( pCover );
    return pFForm;
}